

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surf.cc
# Opt level: O0

bool __thiscall features::Surf::keypoint_localization(Surf *this,Keypoint *kp)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  reference pvVar23;
  __shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var24;
  ImageBase *pIVar25;
  TypedImageBase<float> *pTVar26;
  float *pfVar27;
  float *pfVar28;
  float *pfVar29;
  double *pdVar30;
  double dVar31;
  int local_18c;
  float local_188;
  float local_184;
  float sampling;
  float dog_value;
  Vec3d vec_x;
  double local_120;
  double det_a;
  Matrix3d mat_a;
  Vec3d vec_b;
  float N9 [3] [9];
  RespType *s2;
  RespType *s1;
  RespType *s0;
  int off;
  int w;
  int sample;
  Keypoint *kp_local;
  Surf *this_local;
  
  iVar20 = (int)kp->sample;
  pvVar23 = std::vector<features::Surf::Octave,_std::allocator<features::Surf::Octave>_>::operator[]
                      (&this->octaves,(long)kp->octave);
  p_Var24 = (__shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
            std::
            vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
            ::operator[](&pvVar23->imgs,(long)iVar20);
  pIVar25 = (ImageBase *)
            std::__shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->(p_Var24);
  iVar21 = core::ImageBase::width(pIVar25);
  iVar22 = (int)kp->x + (int)kp->y * iVar21;
  pvVar23 = std::vector<features::Surf::Octave,_std::allocator<features::Surf::Octave>_>::operator[]
                      (&this->octaves,(long)kp->octave);
  p_Var24 = (__shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
            std::
            vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
            ::operator[](&pvVar23->imgs,(long)(iVar20 + -1));
  pTVar26 = &std::__shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(p_Var24)->super_TypedImageBase<float>;
  pfVar27 = core::TypedImageBase<float>::get_data_pointer(pTVar26);
  pfVar27 = pfVar27 + iVar22;
  pvVar23 = std::vector<features::Surf::Octave,_std::allocator<features::Surf::Octave>_>::operator[]
                      (&this->octaves,(long)kp->octave);
  p_Var24 = (__shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
            std::
            vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
            ::operator[](&pvVar23->imgs,(long)iVar20);
  pTVar26 = &std::__shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(p_Var24)->super_TypedImageBase<float>;
  pfVar28 = core::TypedImageBase<float>::get_data_pointer(pTVar26);
  pfVar28 = pfVar28 + iVar22;
  pvVar23 = std::vector<features::Surf::Octave,_std::allocator<features::Surf::Octave>_>::operator[]
                      (&this->octaves,(long)kp->octave);
  p_Var24 = (__shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
            std::
            vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
            ::operator[](&pvVar23->imgs,(long)(iVar20 + 1));
  pTVar26 = &std::__shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(p_Var24)->super_TypedImageBase<float>;
  pfVar29 = core::TypedImageBase<float>::get_data_pointer(pTVar26);
  pfVar29 = pfVar29 + iVar22;
  fVar1 = pfVar27[-iVar21];
  fVar2 = pfVar27[-1];
  fVar3 = *pfVar27;
  fVar4 = pfVar27[1];
  fVar5 = pfVar27[iVar21];
  fVar6 = pfVar28[-1 - iVar21];
  fVar7 = pfVar28[-iVar21];
  fVar8 = pfVar28[1 - iVar21];
  fVar9 = pfVar28[-1];
  fVar10 = *pfVar28;
  fVar11 = pfVar28[1];
  fVar12 = pfVar28[iVar21 + -1];
  fVar13 = pfVar28[iVar21];
  fVar14 = pfVar28[iVar21 + 1];
  fVar15 = pfVar29[-iVar21];
  fVar16 = pfVar29[-1];
  fVar17 = *pfVar29;
  fVar18 = pfVar29[1];
  fVar19 = pfVar29[iVar21];
  math::Vector<double,_3>::Vector((Vector<double,_3> *)(mat_a.m + 8));
  math::Matrix<double,_3,_3>::Matrix((Matrix<double,_3,_3> *)&det_a);
  pdVar30 = math::Vector<double,_3>::operator[]((Vector<double,_3> *)(mat_a.m + 8),0);
  *pdVar30 = (double)-(fVar11 - fVar9) * 0.5;
  pdVar30 = math::Vector<double,_3>::operator[]((Vector<double,_3> *)(mat_a.m + 8),1);
  *pdVar30 = (double)-(fVar13 - fVar7) * 0.5;
  pdVar30 = math::Vector<double,_3>::operator[]((Vector<double,_3> *)(mat_a.m + 8),2);
  *pdVar30 = (double)-(fVar17 - fVar3) * 0.5;
  pdVar30 = math::Matrix<double,_3,_3>::operator[]((Matrix<double,_3,_3> *)&det_a,0);
  *pdVar30 = ((double)fVar9 - ((double)fVar10 + (double)fVar10)) + (double)fVar11;
  pdVar30 = math::Matrix<double,_3,_3>::operator[]((Matrix<double,_3,_3> *)&det_a,1);
  *pdVar30 = (double)(((fVar14 - fVar12) - fVar8) + fVar6) * 0.25;
  pdVar30 = math::Matrix<double,_3,_3>::operator[]((Matrix<double,_3,_3> *)&det_a,2);
  *pdVar30 = (double)(((fVar18 - fVar16) - fVar4) + fVar2) * 0.25;
  pdVar30 = math::Matrix<double,_3,_3>::operator[]((Matrix<double,_3,_3> *)&det_a,1);
  dVar31 = *pdVar30;
  pdVar30 = math::Matrix<double,_3,_3>::operator[]((Matrix<double,_3,_3> *)&det_a,3);
  *pdVar30 = dVar31;
  pdVar30 = math::Matrix<double,_3,_3>::operator[]((Matrix<double,_3,_3> *)&det_a,4);
  *pdVar30 = ((double)fVar7 - ((double)fVar10 + (double)fVar10)) + (double)fVar13;
  pdVar30 = math::Matrix<double,_3,_3>::operator[]((Matrix<double,_3,_3> *)&det_a,5);
  *pdVar30 = (double)(((fVar19 - fVar15) - fVar5) + fVar1) * 0.25;
  pdVar30 = math::Matrix<double,_3,_3>::operator[]((Matrix<double,_3,_3> *)&det_a,2);
  dVar31 = *pdVar30;
  pdVar30 = math::Matrix<double,_3,_3>::operator[]((Matrix<double,_3,_3> *)&det_a,6);
  *pdVar30 = dVar31;
  pdVar30 = math::Matrix<double,_3,_3>::operator[]((Matrix<double,_3,_3> *)&det_a,5);
  dVar31 = *pdVar30;
  pdVar30 = math::Matrix<double,_3,_3>::operator[]((Matrix<double,_3,_3> *)&det_a,7);
  *pdVar30 = dVar31;
  pdVar30 = math::Matrix<double,_3,_3>::operator[]((Matrix<double,_3,_3> *)&det_a,8);
  *pdVar30 = ((double)fVar3 - ((double)fVar10 + (double)fVar10)) + (double)fVar17;
  local_120 = math::matrix_determinant<double>((Matrix<double,_3,_3> *)&det_a);
  if ((local_120 < -9.999999747378752e-06) || (9.999999747378752e-06 < local_120)) {
    math::matrix_inverse<double>
              ((Matrix<double,_3,_3> *)(vec_x.v + 2),(Matrix<double,_3,_3> *)&det_a,&local_120);
    math::Matrix<double,_3,_3>::operator=
              ((Matrix<double,_3,_3> *)&det_a,(Matrix<double,_3,_3> *)(vec_x.v + 2));
    math::Matrix<double,_3,_3>::operator*
              ((Vector<double,_3> *)&sampling,(Matrix<double,_3,_3> *)&det_a,
               (Vector<double,_3> *)(mat_a.m + 8));
    dVar31 = math::Vector<double,_3>::maximum((Vector<double,_3> *)&sampling);
    if ((dVar31 <= 0.5) &&
       (dVar31 = math::Vector<double,_3>::minimum((Vector<double,_3> *)&sampling), -0.5 <= dVar31))
    {
      dVar31 = math::Vector<double,_3>::dot
                         ((Vector<double,_3> *)(mat_a.m + 8),(Vector<double,_3> *)&sampling);
      local_184 = (float)(dVar31 * -0.5 + (double)fVar10);
      if (local_184 < (this->options).contrast_threshold) {
        return false;
      }
      local_18c = 2;
      iVar20 = math::fastpow<int>(&local_18c,kp->octave);
      local_188 = (float)iVar20;
      fVar1 = kp->x;
      pdVar30 = math::Vector<double,_3>::operator[]((Vector<double,_3> *)&sampling,0);
      kp->x = (float)(((double)fVar1 + *pdVar30) * (double)local_188);
      fVar1 = kp->y;
      pdVar30 = math::Vector<double,_3>::operator[]((Vector<double,_3> *)&sampling,1);
      kp->y = (float)(((double)fVar1 + *pdVar30) * (double)local_188);
      pdVar30 = math::Vector<double,_3>::operator[]((Vector<double,_3> *)&sampling,2);
      kp->sample = (float)((double)kp->sample + *pdVar30);
      if (0.0 < kp->x || kp->x == 0.0) {
        fVar1 = kp->x;
        pIVar25 = (ImageBase *)
                  std::
                  __shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&this->sat);
        iVar20 = core::ImageBase::width(pIVar25);
        if ((fVar1 + 1.0 <= (float)iVar20) && (0.0 < kp->y || kp->y == 0.0)) {
          fVar1 = kp->y;
          pIVar25 = (ImageBase *)
                    std::
                    __shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&this->sat);
          iVar20 = core::ImageBase::height(pIVar25);
          if (fVar1 + 1.0 <= (float)iVar20) {
            return true;
          }
        }
      }
      return false;
    }
  }
  return false;
}

Assistant:

bool
Surf::keypoint_localization (Keypoint* kp)
{
    int const sample = static_cast<int>(kp->sample);
    int const w = this->octaves[kp->octave].imgs[sample]->width();
    //int const h = this->octaves[kp->octave].imgs[sample]->height();
    int off = static_cast<int>(kp->x) + static_cast<int>(kp->y) * w;
    Octave::RespType const *s0, *s1, *s2;
    s0 = this->octaves[kp->octave].imgs[sample - 1]->get_data_pointer() + off;
    s1 = this->octaves[kp->octave].imgs[sample]->get_data_pointer() + off;
    s2 = this->octaves[kp->octave].imgs[sample + 1]->get_data_pointer() + off;

    float N9[3][9] =
    {
        { s0[-1-w], s0[-w], s0[1-w], s0[-1], s0[0], s0[1], s0[w-1], s0[w], s0[1+w] },
        { s1[-1-w], s1[-w], s1[1-w], s1[-1], s1[0], s1[1], s1[w-1], s1[w], s1[1+w] },
        { s2[-1-w], s2[-w], s2[1-w], s2[-1], s2[0], s2[1], s2[w-1], s2[w], s2[1+w] }
    };

    /* Switch to processing in double. Determinant can be very large. */
    math::Vec3d vec_b;
    math::Matrix3d mat_a;
    vec_b[0] = -(N9[1][5] - N9[1][3]) * 0.5;  // 1st deriv x.
    vec_b[1] = -(N9[1][7] - N9[1][1]) * 0.5;  // 1st deriv y.
    vec_b[2] = -(N9[2][4] - N9[0][4]) * 0.5;  // 1st deriv s.

    mat_a[0] = N9[1][3] - 2.0 * N9[1][4] + N9[1][5];                 // xx
    mat_a[1] = (N9[1][8] - N9[1][6] - N9[1][2] + N9[1][0]) * 0.25;   // xy
    mat_a[2] = (N9[2][5] - N9[2][3] - N9[0][5] + N9[0][3]) * 0.25;   // xs
    mat_a[3] = mat_a[1];                                             // yx
    mat_a[4] = N9[1][1] - 2.0 * N9[1][4] + N9[1][7];                 // yy
    mat_a[5] = (N9[2][7] - N9[2][1] - N9[0][7] + N9[0][1]) * 0.25;   // ys
    mat_a[6] = mat_a[2];                                             // sx
    mat_a[7] = mat_a[5];                                             // sy
    mat_a[8] = N9[0][4] - 2.0 * N9[1][4] + N9[2][4];                 // ss

    /* Compute determinant to detect singular matrix. */
    double det_a = math::matrix_determinant(mat_a);
    //std::cout << "Determinant: " << det_a << std::endl;
    if (MATH_EPSILON_EQ(det_a, 0.0f, 1.0e-5f))
    {
        //std::cout << "Rejection keypoint: det = " << det_a << std::endl;
        return false;
    }

    /* Invert the matrix to get the accurate keypoint. */
    mat_a = math::matrix_inverse(mat_a, det_a);
    math::Vec3d vec_x = mat_a * vec_b;

    /* Reject keypoint if location is too far off original point. */
    if (vec_x.maximum() > 0.5 || vec_x.minimum() < -0.5f)
        return false;

    /* Compute actual DoG value at accurate keypoint x. */
    float dog_value = N9[1][4] - 0.5 * vec_b.dot(vec_x);
    if (dog_value < this->options.contrast_threshold)
    {
        //std::cout << "Rejection keypoint: Contrast Thres" << std::endl;
        return false;
    }

    /* Update keypoint. */
    float sampling = static_cast<float>(math::fastpow(2, kp->octave));
    kp->x = (kp->x + vec_x[0]) * sampling;
    kp->y = (kp->y + vec_x[1]) * sampling;
    // OpenSURF code: ipt.scale = static_cast<float>((0.1333f) * (m->filter + xi * filterStep));
    kp->sample += vec_x[2]; // Is this correct? No! FIXME!

    if (kp->x < 0.0f || kp->x + 1.0f > this->sat->width()
        || kp->y < 0.0f || kp->y + 1.0f > this->sat->height())
    {
        //std::cout << "SURF: Rejection keypoint: OOB "
        //    << kp->x << " " << kp->y  << " / " << vec_x[0] << " "
        //    << vec_x[1] << std::endl;
        return false;
    }

    return true;
}